

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::peer_disconnected_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_disconnected_alert *this)

{
  undefined8 uVar1;
  error_category *peVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  char buf [600];
  
  peer_alert::message_abi_cxx11_(&local_2e8,&this->super_peer_alert);
  if ((ulong)this->op < 0x2b) {
    pcVar4 = operation_name::names[this->op];
  }
  else {
    pcVar4 = "unknown operation";
  }
  uVar1 = *(undefined8 *)
           ((anonymous_namespace)::socket_type_str +
           (long)*(int *)&(this->super_peer_alert).field_0x9c * 8);
  iVar3 = (**((this->error).cat_)->_vptr_error_category)();
  peVar2 = (this->error).cat_;
  (*peVar2->_vptr_error_category[4])(&local_2c8,peVar2,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_2a8,&local_2c8);
  snprintf(buf,600,"%s disconnecting (%s) [%s] [%s]: %s (reason: %d)",local_2e8._M_dataplus._M_p,
           uVar1,pcVar4,CONCAT44(extraout_var,iVar3),local_2a8._M_dataplus._M_p,(ulong)this->reason)
  ;
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,buf,(allocator<char> *)&local_2e8);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_disconnected_alert::message() const
	{
		char buf[600];
		std::snprintf(buf, sizeof(buf), "%s disconnecting (%s) [%s] [%s]: %s (reason: %d)"
			, peer_alert::message().c_str()
			, socket_type_str[socket_type]
			, operation_name(op), error.category().name()
			, convert_from_native(error.message()).c_str()
			, int(reason));
		return buf;
	}